

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PFData_test.cpp
# Opt level: O0

void __thiscall
PFData_test_helperFunctions_Test::PFData_test_helperFunctions_Test
          (PFData_test_helperFunctions_Test *this)

{
  PFData_test *in_RDI;
  
  PFData_test::PFData_test(in_RDI);
  (in_RDI->super_Test)._vptr_Test = (_func_int **)&PTR__PFData_test_helperFunctions_Test_001adf80;
  return;
}

Assistant:

TEST_F(PFData_test, helperFunctions){
    PFData test("tests/inputs/press.init.pfb");
    int retval = test.loadHeader();
    EXPECT_EQ(0,retval);

    retval = test.loadPQR();
    EXPECT_EQ(0,retval);

    //getNormalBlockStartGrid
    EXPECT_EQ(test.getNormalBlockStartGridZ(),  0);
    EXPECT_EQ(test.getNormalBlockStartGridY(),  1);
    EXPECT_EQ(test.getNormalBlockStartGridX(),  1);

    //getNormalBlockStart
    EXPECT_EQ(test.getNormalBlockStartZ(),      0);
    EXPECT_EQ(test.getNormalBlockStartY(),      11);
    EXPECT_EQ(test.getNormalBlockStartX(),      11);

    //getNormalBlockSize
    EXPECT_EQ(test.getNormalBlockSizeZ(),       50);
    EXPECT_EQ(test.getNormalBlockSizeY(),       10);
    EXPECT_EQ(test.getNormalBlockSizeX(),       10);

    EXPECT_EQ(test.getNormalBlockSizeZ(),       50);
    EXPECT_EQ(test.getNormalBlockSizeY(),       10);
    EXPECT_EQ(test.getNormalBlockSizeX(),       10);

    //getSubgridStart
    EXPECT_EQ(test.getSubgridStartZ(0),         0);

    EXPECT_EQ(test.getSubgridStartY(0),         0);
    EXPECT_EQ(test.getSubgridStartY(1),         11);
    EXPECT_EQ(test.getSubgridStartY(2),         21);
    EXPECT_EQ(test.getSubgridStartY(3),         31);

    EXPECT_EQ(test.getSubgridStartX(0),         0);
    EXPECT_EQ(test.getSubgridStartX(1),         11);
    EXPECT_EQ(test.getSubgridStartX(2),         21);
    EXPECT_EQ(test.getSubgridStartX(3),         31);

    //getSubgridSize
    EXPECT_EQ(test.getSubgridSizeZ(0),          50);

    EXPECT_EQ(test.getSubgridSizeY(0),          11);
    EXPECT_EQ(test.getSubgridSizeY(1),          10);
    EXPECT_EQ(test.getSubgridSizeY(2),          10);
    EXPECT_EQ(test.getSubgridSizeY(3),          10);

    EXPECT_EQ(test.getSubgridSizeX(0),          11);
    EXPECT_EQ(test.getSubgridSizeX(1),          10);
    EXPECT_EQ(test.getSubgridSizeX(2),          10);
    EXPECT_EQ(test.getSubgridSizeX(3),          10);

    //getSubgridIndex
    EXPECT_EQ(test.getSubgridIndexZ(0),         0);
    EXPECT_EQ(test.getSubgridIndexZ(49),        0);

    EXPECT_EQ(test.getSubgridIndexY(0),         0);
    EXPECT_EQ(test.getSubgridIndexY(10),        0);
    EXPECT_EQ(test.getSubgridIndexY(11),        1);
    EXPECT_EQ(test.getSubgridIndexY(20),        1);
    EXPECT_EQ(test.getSubgridIndexY(21),        2);
    EXPECT_EQ(test.getSubgridIndexY(30),        2);
    EXPECT_EQ(test.getSubgridIndexY(31),        3);
    EXPECT_EQ(test.getSubgridIndexY(40),        3);

    EXPECT_EQ(test.getSubgridIndexX(0),         0);
    EXPECT_EQ(test.getSubgridIndexX(10),        0);
    EXPECT_EQ(test.getSubgridIndexX(11),        1);
    EXPECT_EQ(test.getSubgridIndexX(20),        1);
    EXPECT_EQ(test.getSubgridIndexX(21),        2);
    EXPECT_EQ(test.getSubgridIndexX(30),        2);
    EXPECT_EQ(test.getSubgridIndexX(31),        3);
    EXPECT_EQ(test.getSubgridIndexX(40),        3);
}